

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_10x10(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  JSAMPROW pJVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  DCTELEM *pDVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int local_78 [8];
  int aiStack_58 [4];
  DCTELEM workspace [16];
  
  uVar4 = (ulong)start_col;
  lVar8 = 0;
  pDVar15 = data;
  do {
    pJVar3 = sample_data[lVar8];
    uVar11 = (ulong)((uint)pJVar3[uVar4] + (uint)pJVar3[uVar4 + 9]);
    uVar18 = (ulong)((uint)pJVar3[uVar4 + 1] + (uint)pJVar3[uVar4 + 8]);
    uVar22 = (ulong)((uint)pJVar3[uVar4 + 3] + (uint)pJVar3[uVar4 + 6]);
    uVar14 = (ulong)((uint)pJVar3[uVar4 + 4] + (uint)pJVar3[uVar4 + 5]);
    lVar9 = uVar14 + uVar11;
    lVar12 = uVar11 - uVar14;
    lVar20 = uVar22 + uVar18;
    lVar19 = uVar18 - uVar22;
    lVar10 = (ulong)pJVar3[uVar4] - (ulong)pJVar3[uVar4 + 9];
    lVar5 = (ulong)pJVar3[uVar4 + 1] - (ulong)pJVar3[uVar4 + 8];
    iVar13 = (uint)pJVar3[uVar4 + 2] + (uint)pJVar3[uVar4 + 7];
    lVar17 = (ulong)pJVar3[uVar4 + 2] - (ulong)pJVar3[uVar4 + 7];
    lVar7 = (ulong)pJVar3[uVar4 + 3] - (ulong)pJVar3[uVar4 + 6];
    lVar16 = (ulong)pJVar3[uVar4 + 4] - (ulong)pJVar3[uVar4 + 5];
    *pDVar15 = ((int)lVar9 + (int)lVar20 + iVar13) * 2 + -0xa00;
    pDVar15[4] = (int)(lVar20 * 0xffffffff204 + (ulong)(uint)(iVar13 * 2) * -0x1000000016a1 +
                       lVar9 * 0x249d + 0x800 >> 0xc);
    lVar9 = (lVar19 + lVar12) * 0x1a9a;
    pDVar15[2] = (int)(lVar12 * 0x1071 + lVar9 + 0x800U >> 0xc);
    pDVar15[6] = (int)(lVar9 + lVar19 * 0xfffffffba5c + 0x800U >> 0xc);
    pDVar15[5] = (((int)(lVar16 + lVar10) - (int)lVar17) - (int)(lVar5 - lVar7)) * 2;
    pDVar15[1] = (int)((ulong)(lVar16 * 0x714 + 0x800 +
                              lVar7 * 0x148c + lVar17 * 0x2000 + lVar5 * 0x2853 + lVar10 * 0x2cb3)
                      >> 0xc);
    lVar20 = (lVar5 - lVar7) * 0x19e3 + lVar17 * -0x2000 + (lVar16 + lVar10) * 0x9e3;
    lVar9 = (lVar7 + lVar5) * -0x12cf + (lVar10 - lVar16) * 0x1e6f + 0x800;
    pDVar15[3] = (int)((ulong)(lVar9 + lVar20) >> 0xc);
    pDVar15[7] = (int)((ulong)(lVar9 - lVar20) >> 0xc);
    piVar6 = local_78;
    if ((int)lVar8 != 7) {
      if ((int)lVar8 == 9) {
        lVar8 = 0;
        do {
          iVar13 = local_78[lVar8];
          iVar1 = aiStack_58[lVar8];
          iVar2 = data[lVar8];
          lVar12 = (long)(iVar1 + iVar2);
          lVar10 = (long)(iVar13 + data[lVar8 + 8]);
          lVar5 = (long)(data[lVar8 + 0x30] + data[lVar8 + 0x18]);
          lVar20 = (long)(data[lVar8 + 0x28] + data[lVar8 + 0x20]);
          lVar9 = lVar20 + lVar12;
          lVar12 = lVar12 - lVar20;
          lVar20 = lVar10 + lVar5;
          lVar10 = lVar10 - lVar5;
          lVar5 = (long)(data[lVar8 + 0x38] + data[lVar8 + 0x10]);
          data[lVar8] = (DCTELEM)((lVar20 + lVar5 + lVar9) * 0x28f6 + 0x4000U >> 0xf);
          lVar16 = (long)(iVar2 - iVar1);
          lVar17 = (long)(data[lVar8 + 8] - iVar13);
          lVar19 = (long)(data[lVar8 + 0x10] - data[lVar8 + 0x38]);
          lVar7 = (long)(data[lVar8 + 0x18] - data[lVar8 + 0x30]);
          lVar21 = (long)(data[lVar8 + 0x20] - data[lVar8 + 0x28]);
          data[lVar8 + 0x20] =
               (DCTELEM)(lVar20 * 0x7fffffffee1a + lVar5 * -0x10000000039ee + lVar9 * 0x2edd +
                         0x4000U >> 0xf);
          lVar9 = (lVar12 + lVar10) * 0x220c;
          data[lVar8 + 0x10] = (DCTELEM)(lVar12 * 0x150b + lVar9 + 0x4000U >> 0xf);
          data[lVar8 + 0x30] = (DCTELEM)(lVar9 + lVar10 * 0x7fffffffa6dc + 0x4000U >> 0xf);
          data[lVar8 + 0x28] =
               (DCTELEM)((((lVar21 + lVar16) - (lVar17 - lVar7)) - lVar19) * 0x28f6 + 0x4000U >> 0xf
                        );
          data[lVar8 + 8] =
               (DCTELEM)((ulong)(lVar21 * 0x910 + 0x4000 +
                                lVar7 * 0x1a4c + lVar19 * 0x28f6 + lVar17 * 0x339d + lVar16 * 0x3937
                                ) >> 0xf);
          lVar9 = (lVar17 - lVar7) * 0x2123 + lVar19 * -0x28f6 + (lVar21 + lVar16) * 0xca8;
          lVar20 = (lVar7 + lVar17) * -0x1813 + (lVar16 - lVar21) * 0x26f5 + 0x4000;
          data[lVar8 + 0x18] = (DCTELEM)((ulong)(lVar20 + lVar9) >> 0xf);
          data[lVar8 + 0x38] = (DCTELEM)((ulong)(lVar20 - lVar9) >> 0xf);
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 8);
        return;
      }
      piVar6 = pDVar15 + 8;
    }
    lVar8 = lVar8 + 1;
    pDVar15 = piVar6;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x10 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM workspace[8*2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << 1);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-1);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-1);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << 1);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-1);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 10)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/10)**2 = 16/25, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/20) * 32/25.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*0];
    tmp12 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*5];

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*0];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*5];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(1.28)), /* 32/25 */
	      CONST_BITS+2);
    tmp12 += tmp12;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.464477191)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.559380511)),  /* c8 */
	      CONST_BITS+2);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(1.064004961));    /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.657591230)),  /* c2-c6 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.785601151)),  /* c2+c6 */
	      CONST_BITS+2);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp2, FIX(1.28)),  /* 32/25 */
	      CONST_BITS+2);
    tmp2 = MULTIPLY(tmp2, FIX(1.28));                     /* 32/25 */
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.787906876)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.612894094)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.821810588)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.283176630)),           /* c9 */
	      CONST_BITS+2);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(1.217352341)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.752365123));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.395541753)) +   /* (c3-c7)/2 */
	    MULTIPLY(tmp11, FIX(0.64)) - tmp2;            /* 16/25 */
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}